

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::Begin(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream ss;
  int indent_local;
  bool binary_local;
  StreamWriterLE *s_local;
  Node *this_local;
  
  if (binary) {
    BeginBinary(this,s);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    BeginAscii(this,(ostream *)local_198,indent);
    std::__cxx11::ostringstream::str();
    StreamWriter<false,_false>::PutString(s,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void FBX::Node::Begin(
    Assimp::StreamWriterLE &s,
    bool binary, int indent
) {
    if (binary) {
        BeginBinary(s);
    } else {
        // assume we're at the correct place to start already
        (void)indent;
        std::ostringstream ss;
        BeginAscii(ss, indent);
        s.PutString(ss.str());
    }
}